

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

TestCaseGroup * vkt::image::createImageStoreTests(TestContext *testCtx)

{
  undefined8 uVar1;
  ImageType IVar2;
  int iVar3;
  TestCaseGroup *pTVar4;
  char *pcVar5;
  TestNode *pTVar6;
  StoreTest *pSVar7;
  TestNode *pTVar8;
  ImageType imageType;
  ImageType imageType_00;
  VkFormat format;
  VkFormat format_00;
  VkFormat format_01;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_162;
  allocator<char> local_161;
  string local_160;
  string local_140;
  undefined1 local_11a;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  int local_d8;
  byte local_d3;
  DefaultDeleter<tcu::TestCaseGroup> local_d2;
  undefined1 local_d1;
  int formatNdx;
  bool isLayered;
  undefined1 local_b0 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
  groupWithoutFormatByImageViewType;
  string local_98;
  undefined1 local_78 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
  groupWithFormatByImageViewType;
  Texture *texture;
  int textureNdx;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroupWithoutFormat;
  undefined1 local_40 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroupWithFormat;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  TestContext *testCtx_local;
  
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _8_8_ = testCtx;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(TestContext *)
                    testGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"store","Plain imageStore() cases");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &testGroupWithFormat.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xb);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar4
            );
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(TestContext *)
                    testGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"with_format","Declare a format layout qualifier for write images")
  ;
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &testGroupWithoutFormat.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_40,pTVar4
            );
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(TestContext *)
                    testGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"without_format",
             "Do not declare a format layout qualifier for write images");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&texture + 7));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&textureNdx,
             pTVar4);
  for (texture._0_4_ = 0; (int)texture < 8; texture._0_4_ = (int)texture + 1) {
    groupWithFormatByImageViewType.
    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
         (anonymous_namespace)::s_textures + (long)(int)texture * 0x18;
    pTVar4 = (TestCaseGroup *)operator_new(0x70);
    uVar1 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
            m_data._8_8_;
    groupWithoutFormatByImageViewType.
    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._15_1_ = 1;
    IVar2 = Texture::type((Texture *)
                          groupWithFormatByImageViewType.
                          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                          .m_data._8_8_);
    getImageTypeName_abi_cxx11_(&local_98,(image *)(ulong)IVar2,imageType);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup(pTVar4,(TestContext *)uVar1,pcVar5,"");
    groupWithoutFormatByImageViewType.
    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._15_1_ = 0;
    de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
              ((DefaultDeleter<tcu::TestCaseGroup> *)
               &groupWithoutFormatByImageViewType.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xe);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_78,
               pTVar4);
    std::__cxx11::string::~string((string *)&local_98);
    pTVar4 = (TestCaseGroup *)operator_new(0x70);
    uVar1 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
            m_data._8_8_;
    local_d1 = 1;
    IVar2 = Texture::type((Texture *)
                          groupWithFormatByImageViewType.
                          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                          .m_data._8_8_);
    getImageTypeName_abi_cxx11_((string *)&formatNdx,(image *)(ulong)IVar2,imageType_00);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup(pTVar4,(TestContext *)uVar1,pcVar5,"");
    local_d1 = 0;
    de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_d2);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_b0,
               pTVar4);
    std::__cxx11::string::~string((string *)&formatNdx);
    iVar3 = Texture::numLayers((Texture *)
                               groupWithFormatByImageViewType.
                               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                               .m_data._8_8_);
    local_d3 = 1 < iVar3;
    for (local_d8 = 0; local_d8 < 0xd; local_d8 = local_d8 + 1) {
      pTVar6 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                ::operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_78)->super_TestNode;
      pSVar7 = (StoreTest *)operator_new(0x90);
      uVar1 = testGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              _8_8_;
      local_11a = 1;
      getFormatShortString_abi_cxx11_
                (&local_f8,
                 (image *)(ulong)*(uint *)((anonymous_namespace)::s_formats + (long)local_d8 * 4),
                 format);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_119);
      anon_unknown_0::StoreTest::StoreTest
                (pSVar7,(TestContext *)uVar1,&local_f8,&local_118,
                 (Texture *)
                 groupWithFormatByImageViewType.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data._8_8_,*(VkFormat *)((anonymous_namespace)::s_formats + (long)local_d8 * 4),2
                );
      local_11a = 0;
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar7);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      std::__cxx11::string::~string((string *)&local_f8);
      pTVar6 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                ::operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_b0)->super_TestNode;
      pSVar7 = (StoreTest *)operator_new(0x90);
      uVar1 = testGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              _8_8_;
      local_162 = 1;
      getFormatShortString_abi_cxx11_
                (&local_140,
                 (image *)(ulong)*(uint *)((anonymous_namespace)::s_formats + (long)local_d8 * 4),
                 format_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"",&local_161);
      anon_unknown_0::StoreTest::StoreTest
                (pSVar7,(TestContext *)uVar1,&local_140,&local_160,
                 (Texture *)
                 groupWithFormatByImageViewType.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data._8_8_,*(VkFormat *)((anonymous_namespace)::s_formats + (long)local_d8 * 4),0
                );
      local_162 = 0;
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar7);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator(&local_161);
      std::__cxx11::string::~string((string *)&local_140);
      if ((local_d3 & 1) != 0) {
        pTVar6 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_78)->super_TestNode;
        pSVar7 = (StoreTest *)operator_new(0x90);
        uVar1 = testGroup.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                ._8_8_;
        getFormatShortString_abi_cxx11_
                  (&local_1a8,
                   (image *)(ulong)*(uint *)((anonymous_namespace)::s_formats + (long)local_d8 * 4),
                   format_01);
        std::operator+(&local_188,&local_1a8,"_single_layer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"",&local_1c9);
        anon_unknown_0::StoreTest::StoreTest
                  (pSVar7,(TestContext *)uVar1,&local_188,&local_1c8,
                   (Texture *)
                   groupWithFormatByImageViewType.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data._8_8_,*(VkFormat *)((anonymous_namespace)::s_formats + (long)local_d8 * 4)
                   ,3);
        tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::allocator<char>::~allocator(&local_1c9);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
    }
    pTVar6 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_40)->super_TestNode;
    pTVar8 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_78)->super_TestNode;
    tcu::TestNode::addChild(pTVar6,pTVar8);
    pTVar6 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         &textureNdx)->super_TestNode;
    pTVar8 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_b0)->super_TestNode;
    tcu::TestNode::addChild(pTVar6,pTVar8);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_b0);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_78);
  }
  pTVar6 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar8 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_40
                   )->super_TestNode;
  tcu::TestNode::addChild(pTVar6,pTVar8);
  pTVar6 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar8 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &textureNdx)->super_TestNode;
  tcu::TestNode::addChild(pTVar6,pTVar8);
  pTVar4 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&textureNdx);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_40);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar4;
}

Assistant:

tcu::TestCaseGroup* createImageStoreTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "store", "Plain imageStore() cases"));
	de::MovePtr<tcu::TestCaseGroup> testGroupWithFormat(new tcu::TestCaseGroup(testCtx, "with_format", "Declare a format layout qualifier for write images"));
	de::MovePtr<tcu::TestCaseGroup> testGroupWithoutFormat(new tcu::TestCaseGroup(testCtx, "without_format", "Do not declare a format layout qualifier for write images"));

	for (int textureNdx = 0; textureNdx < DE_LENGTH_OF_ARRAY(s_textures); ++textureNdx)
	{
		const Texture& texture = s_textures[textureNdx];
		de::MovePtr<tcu::TestCaseGroup> groupWithFormatByImageViewType (new tcu::TestCaseGroup(testCtx, getImageTypeName(texture.type()).c_str(), ""));
		de::MovePtr<tcu::TestCaseGroup> groupWithoutFormatByImageViewType (new tcu::TestCaseGroup(testCtx, getImageTypeName(texture.type()).c_str(), ""));
		const bool isLayered = (texture.numLayers() > 1);

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(s_formats); ++formatNdx)
		{
			groupWithFormatByImageViewType->addChild(new StoreTest(testCtx, getFormatShortString(s_formats[formatNdx]), "", texture, s_formats[formatNdx]));
			groupWithoutFormatByImageViewType->addChild(new StoreTest(testCtx, getFormatShortString(s_formats[formatNdx]), "", texture, s_formats[formatNdx], 0));

			if (isLayered)
				groupWithFormatByImageViewType->addChild(new StoreTest(testCtx, getFormatShortString(s_formats[formatNdx]) + "_single_layer", "",
														texture, s_formats[formatNdx],
														StoreTest::FLAG_SINGLE_LAYER_BIND | StoreTest::FLAG_DECLARE_IMAGE_FORMAT_IN_SHADER));
		}

		testGroupWithFormat->addChild(groupWithFormatByImageViewType.release());
		testGroupWithoutFormat->addChild(groupWithoutFormatByImageViewType.release());
	}

	testGroup->addChild(testGroupWithFormat.release());
	testGroup->addChild(testGroupWithoutFormat.release());

	return testGroup.release();
}